

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

image * __thiscall
basisu::image::extract_block_clamped
          (image *this,color_rgba *pDst,uint32_t src_x,uint32_t src_y,uint32_t w,uint32_t h)

{
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *paVar1;
  color_rgba *__src;
  uint32_t uVar2;
  uint32_t y;
  uint32_t uVar3;
  uint32_t x;
  bool bVar4;
  
  if ((this->m_width < w + src_x) || (this->m_height < h + src_y)) {
    for (uVar3 = 0; uVar3 != h; uVar3 = uVar3 + 1) {
      x = src_x;
      uVar2 = w;
      while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
        paVar1 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                 get_clamped(this,x,src_y + uVar3);
        *pDst = (color_rgba)*paVar1;
        pDst = (color_rgba *)(&pDst->field_0 + 1);
        x = x + 1;
      }
    }
  }
  else {
    __src = vector<basisu::color_rgba>::operator[]
                      (&this->m_pixels,(ulong)(src_y * this->m_pitch + src_x));
    while (bVar4 = h != 0, h = h - 1, bVar4) {
      memcpy(pDst,__src,(ulong)w * 4);
      __src = __src + this->m_pitch;
      pDst = pDst + w;
    }
  }
  return this;
}

Assistant:

const image &extract_block_clamped(color_rgba *pDst, uint32_t src_x, uint32_t src_y, uint32_t w, uint32_t h) const
		{
			if (((src_x + w) > m_width) || ((src_y + h) > m_height))
			{
				// Slower clamping case
				for (uint32_t y = 0; y < h; y++)
					for (uint32_t x = 0; x < w; x++)
						*pDst++ = get_clamped(src_x + x, src_y + y);
			}
			else
			{
				const color_rgba* pSrc = &m_pixels[src_x + src_y * m_pitch];

				for (uint32_t y = 0; y < h; y++)
				{
					memcpy(pDst, pSrc, w * sizeof(color_rgba));
					pSrc += m_pitch;
					pDst += w;
				}
			}

			return *this;
		}